

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkElement.cpp
# Opt level: O2

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::LinkElement::childElementForName(LinkElement *this,string *name)

{
  undefined8 uVar1;
  bool bVar2;
  Link *__args_1;
  char (*__args_1_00) [7];
  char (*__args_1_01) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<iDynTree::XMLElement> sVar4;
  undefined1 local_28 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  bVar2 = std::operator==(in_RDX,"inertial");
  if (bVar2) {
    __args_1 = (Link *)iDynTree::XMLElement::getParserState();
    std::make_shared<iDynTree::InertialElement,iDynTree::XMLParserState&,iDynTree::Link&>
              ((XMLParserState *)local_28,__args_1);
  }
  else {
    bVar2 = std::operator==(in_RDX,"visual");
    if (bVar2) {
      __args_1_00 = (char (*) [7])iDynTree::XMLElement::getParserState();
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      std::
      make_shared<iDynTree::VisualElement,iDynTree::XMLParserState&,char_const(&)[7],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                ((XMLParserState *)local_28,__args_1_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"visual");
    }
    else {
      bVar2 = std::operator==(in_RDX,"collision");
      if (!bVar2) {
        __args_1_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      iDynTree::XMLElement::getParserState();
        sVar4 = std::
                make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
                          ((XMLParserState *)this,__args_1_02);
        _Var3 = sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        goto LAB_0013c023;
      }
      __args_1_01 = (char (*) [10])iDynTree::XMLElement::getParserState();
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      std::
      make_shared<iDynTree::VisualElement,iDynTree::XMLParserState&,char_const(&)[10],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                ((XMLParserState *)local_28,__args_1_01,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"collision");
    }
  }
  uVar1 = local_28._8_8_;
  local_28._8_8_ = 0;
  *(undefined8 *)this = local_28._0_8_;
  *(undefined8 *)&this->field_0x8 = uVar1;
  local_28._0_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  _Var3._M_pi = extraout_RDX;
LAB_0013c023:
  sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> LinkElement::childElementForName(const std::string& name) {
        if (name == "inertial") {
            return std::make_shared<InertialElement>(getParserState(), m_link);
        } else if (name == "visual") {
            return std::make_shared<VisualElement>(getParserState(), "visual", m_model.getPackageDirs());
        } else if (name == "collision") {
            return std::make_shared<VisualElement>(getParserState(), "collision", m_model.getPackageDirs());
        }
        return std::make_shared<iDynTree::XMLElement>(getParserState(), name);
    }